

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

int __thiscall amrex::ParmParse::querykth(ParmParse *this,char *name,int k,float *ptr,int ival)

{
  bool bVar1;
  char *in_RSI;
  allocator *ptr_00;
  string *in_stack_ffffffffffffff80;
  Table *in_stack_ffffffffffffff88;
  allocator local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  ParmParse *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  ptr_00 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,in_RSI,ptr_00);
  prefixedName(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = anon_unknown_12::anon_unknown_0::squeryval<float>
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(float *)ptr_00,
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return (uint)bVar1;
}

Assistant:

int
ParmParse::querykth (const char* name,
                     int         k,
                     float&      ptr,
                     int         ival) const
{
    return squeryval(m_table, prefixedName(name),ptr,ival,k);
}